

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::cpp::HasEnumDefinitions(Descriptor *message_type)

{
  bool bVar1;
  int iVar2;
  Descriptor *message_type_00;
  int local_1c;
  int i;
  Descriptor *message_type_local;
  
  iVar2 = Descriptor::enum_type_count(message_type);
  if (iVar2 < 1) {
    for (local_1c = 0; iVar2 = Descriptor::nested_type_count(message_type), local_1c < iVar2;
        local_1c = local_1c + 1) {
      message_type_00 = Descriptor::nested_type(message_type,local_1c);
      bVar1 = HasEnumDefinitions(message_type_00);
      if (bVar1) {
        return true;
      }
    }
    message_type_local._7_1_ = false;
  }
  else {
    message_type_local._7_1_ = true;
  }
  return message_type_local._7_1_;
}

Assistant:

static bool HasEnumDefinitions(const Descriptor* message_type) {
  if (message_type->enum_type_count() > 0) return true;
  for (int i = 0; i < message_type->nested_type_count(); ++i) {
    if (HasEnumDefinitions(message_type->nested_type(i))) return true;
  }
  return false;
}